

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerCoverageFuncs(Builtins *this)

{
  PredefinedIntegerType *__args_2;
  StringType *pSVar1;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  initializer_list<const_slang::ast::Type_*> __l_05;
  undefined1 local_108 [4];
  undefined1 local_104 [8];
  undefined1 local_fc [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  PredefinedIntegerType *local_e8;
  StringType *local_e0;
  undefined1 local_d8 [48];
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  
  local_104._0_4_ = PackedUnionType;
  __args_2 = &this->intType;
  local_108 = (undefined1  [4])0x3;
  local_fc._0_4_ = 4;
  pSVar1 = &this->stringType;
  __l._M_len = 4;
  __l._M_array = (iterator)(local_fc + 4);
  local_fc._4_8_ = __args_2;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_2;
  local_e8 = __args_2;
  local_e0 = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_d8
             ,__l,(allocator_type *)(local_104 + 7));
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)(local_d8 + 0x20),(PredefinedIntegerType *)local_104,(int *)__args_2
             ,(int *)local_108,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_fc
            );
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._32_8_;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_;
  local_d8._32_8_ = (element_type *)0x0;
  local_d8._40_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_d8);
  local_104._0_4_ = UnpackedUnionType;
  local_108 = (undefined1  [4])0x2;
  local_fc._0_4_ = 3;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_d8;
  local_d8._0_8_ = __args_2;
  local_d8._8_8_ = __args_2;
  local_d8._16_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_00,(allocator_type *)(local_104 + 7));
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)(local_d8 + 0x20),(PredefinedIntegerType *)local_104,(int *)__args_2
             ,(int *)local_108,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_fc
            );
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._32_8_;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_;
  local_d8._32_8_ = (element_type *)0x0;
  local_d8._40_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  local_104._0_4_ = ClassType;
  local_108 = (undefined1  [4])0x2;
  local_fc._0_4_ = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_d8;
  local_d8._0_8_ = __args_2;
  local_d8._8_8_ = __args_2;
  local_d8._16_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_01,(allocator_type *)(local_104 + 7));
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)(local_d8 + 0x20),(PredefinedIntegerType *)local_104,(int *)__args_2
             ,(int *)local_108,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_fc
            );
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._32_8_;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_;
  local_d8._32_8_ = (Scope *)0x0;
  local_d8._40_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  local_104._0_4_ = CovergroupType;
  local_108 = (undefined1  [4])0x2;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)(local_d8 + 0x20);
  local_d8._32_8_ = __args_2;
  local_d8._40_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_02,(allocator_type *)local_fc);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_d8,(PredefinedIntegerType *)local_104,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_108);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._0_8_ = (Type *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  local_104._0_4_ = VoidType;
  local_108 = (undefined1  [4])0x2;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)(local_d8 + 0x20);
  local_d8._32_8_ = __args_2;
  local_d8._40_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_03,(allocator_type *)local_fc);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_d8,(PredefinedIntegerType *)local_104,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_108);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._0_8_ = (Type *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  local_d8._0_4_ = 0x19;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::FloatingType&>
            ((KnownSystemName *)(local_fc + 4),(FloatingType *)local_d8);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_fc._4_8_;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_f0._M_pi;
  local_fc._4_8_ = (pointer)0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
  local_104._0_4_ = CHandleType;
  local_108 = (undefined1  [4])0x1;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)(local_d8 + 0x20);
  local_d8._32_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_04,(allocator_type *)local_fc);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_d8,(VoidType *)local_104,(int *)&this->voidType,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_108);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._0_8_ = (Type *)0x0;
  local_d8._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  local_104._0_4_ = StringType;
  local_108 = (undefined1  [4])0x1;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)(local_d8 + 0x20);
  local_d8._32_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_fc + 4),__l_05,(allocator_type *)local_fc);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_d8,(VoidType *)local_104,(int *)&this->voidType,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_108);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._0_8_ = (Type *)0x0;
  local_d8._8_8_ = (pointer)0x0;
  addSystemSubroutine(this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )(local_fc + 4));
  return;
}

Assistant:

void Builtins::registerCoverageFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name, ...) addSystemSubroutine(std::make_shared<name>(__VA_ARGS__))
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageControl, intType, 3, 4,
             std::vector<const Type*>{&intType, &intType, &intType, &stringType});
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageGetMax, intType, 2, 3,
             std::vector<const Type*>{&intType, &intType, &stringType});
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageGet, intType, 2, 3,
             std::vector<const Type*>{&intType, &intType, &stringType});

    REGISTER(NonConstantFunction, KnownSystemName::CoverageMerge, intType, 2,
             std::vector<const Type*>{&intType, &stringType});
    REGISTER(NonConstantFunction, KnownSystemName::CoverageSave, intType, 2,
             std::vector<const Type*>{&intType, &stringType});
    REGISTER(NonConstantFunction, KnownSystemName::GetCoverage, realType);
    REGISTER(NonConstantFunction, KnownSystemName::SetCoverageDbName, voidType, 1,
             std::vector<const Type*>{&stringType});
    REGISTER(NonConstantFunction, KnownSystemName::LoadCoverageDb, voidType, 1,
             std::vector<const Type*>{&stringType});
#undef REGISTER
}